

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_2> * gl4cts::Math::inverse<2>(Matrix<double,_2,_2> *matrix)

{
  Matrix<double,_2,_2> *result;
  Vector<double,_2> *pVVar1;
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Matrix<double,_2,_2> cof;
  
  cof.m_data.m_data[0].m_data[0] = 1.0;
  cof.m_data.m_data[0].m_data[1] = 0.0;
  cof.m_data.m_data[1].m_data[0] = 0.0;
  cof.m_data.m_data[1].m_data[1] = 1.0;
  lVar2 = 1;
  pVVar1 = (Vector<double,_2> *)&cof;
  auVar4 = _DAT_019fcc00;
  do {
    auVar5 = *(undefined1 (*) [16])(matrix->m_data).m_data[lVar2].m_data;
    auVar6._0_4_ = (auVar4._0_4_ << 0x1f) >> 0x1f;
    auVar6._4_4_ = (auVar4._0_4_ << 0x1f) >> 0x1f;
    auVar6._8_4_ = (auVar4._8_4_ << 0x1f) >> 0x1f;
    auVar6._12_4_ = (auVar4._8_4_ << 0x1f) >> 0x1f;
    auVar6 = ~auVar6 & (auVar5 ^ _DAT_01a45860) | auVar5 & auVar6;
    auVar5._0_8_ = auVar6._8_8_;
    auVar5._8_4_ = auVar6._0_4_;
    auVar5._12_4_ = auVar6._4_4_;
    *(undefined1 (*) [16])((Vector<tcu::Vector<double,_2>,_2> *)pVVar1->m_data)->m_data[0].m_data =
         auVar5;
    lVar2 = 0;
    auVar5 = auVar4 & (undefined1  [16])0x1;
    pVVar1 = cof.m_data.m_data + 1;
    auVar4 = ZEXT416(1);
  } while (auVar5 != (undefined1  [16])0x0);
  dVar3 = 1.0 / ((matrix->m_data).m_data[0].m_data[0] * (matrix->m_data).m_data[1].m_data[1] -
                (matrix->m_data).m_data[1].m_data[0] * (matrix->m_data).m_data[0].m_data[1]);
  (result->m_data).m_data[0].m_data[0] = cof.m_data.m_data[0].m_data[0] * dVar3;
  (result->m_data).m_data[0].m_data[1] = cof.m_data.m_data[1].m_data[0] * dVar3;
  (result->m_data).m_data[1].m_data[0] = cof.m_data.m_data[0].m_data[1] * dVar3;
  (result->m_data).m_data[1].m_data[1] = cof.m_data.m_data[1].m_data[1] * dVar3;
  return result;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}